

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::teximage2d_invalid_buffer_target
               (NegativeTestContext *ctx)

{
  pointer pcVar1;
  ostringstream *this;
  undefined8 *data;
  value_type_conflict5 *__val;
  deUint32 texture;
  deUint32 buf;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  buf = 0x1234;
  texture = 0x1234;
  data = (undefined8 *)operator_new(0x40);
  *data = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&buf);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x88ec,buf);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x88ec,0x40,data,0x88ea);
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,texture);
  NegativeTestContext::expectError(ctx,0);
  pcVar1 = local_198 + 0x10;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,
             "GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to the GL_PIXEL_UNPACK_BUFFER target and..."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_198);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"...the buffer object\'s data store is currently mapped.","");
  NegativeTestContext::beginSection(ctx,(string *)local_198);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  glu::CallLogWrapper::glMapBufferRange(&ctx->super_CallLogWrapper,0x88ec,0,0x20,2);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1908,4,4,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUnmapBuffer(&ctx->super_CallLogWrapper,0x88ec);
  NegativeTestContext::endSection(ctx);
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,
             "...the data would be unpacked from the buffer object such that the memory reads required would exceed the data store size."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_198);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1908,0x40,0x40,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,
             "...data is not evenly divisible into the number of bytes needed to store in memory a datum indicated by type."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_198);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  local_198._0_8_ = (ctx->super_CallLogWrapper).m_log;
  this = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"// Set byte offset = 3",0x16);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_120);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x8057,4,4,0,0x1908,0x8034,(void *)0x3);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&buf);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
  operator_delete(data,0x40);
  return;
}

Assistant:

void teximage2d_invalid_buffer_target (NegativeTestContext& ctx)
{
	deUint32				buf = 0x1234;
	deUint32				texture = 0x1234;
	std::vector<GLubyte>	data(64);

	ctx.glGenBuffers			(1, &buf);
	ctx.glBindBuffer			(GL_PIXEL_UNPACK_BUFFER, buf);
	ctx.glBufferData			(GL_PIXEL_UNPACK_BUFFER, 64, &data[0], GL_DYNAMIC_COPY);
	ctx.glGenTextures			(1, &texture);
	ctx.glBindTexture			(GL_TEXTURE_2D, texture);
	ctx.expectError				(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to the GL_PIXEL_UNPACK_BUFFER target and...");
	ctx.beginSection("...the buffer object's data store is currently mapped.");
	ctx.glMapBufferRange		(GL_PIXEL_UNPACK_BUFFER, 0, 32, GL_MAP_WRITE_BIT);
	ctx.glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError				(GL_INVALID_OPERATION);
	ctx.glUnmapBuffer			(GL_PIXEL_UNPACK_BUFFER);
	ctx.endSection();

	ctx.beginSection("...the data would be unpacked from the buffer object such that the memory reads required would exceed the data store size.");
	ctx.glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA, 64, 64, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError				(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("...data is not evenly divisible into the number of bytes needed to store in memory a datum indicated by type.");
	ctx.getLog() << TestLog::Message << "// Set byte offset = 3" << TestLog::EndMessage;
	ctx.glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGB5_A1, 4, 4, 0, GL_RGBA, GL_UNSIGNED_SHORT_5_5_5_1, (const GLvoid*)3);
	ctx.expectError				(GL_INVALID_OPERATION);
	ctx.endSection();
	ctx.endSection();

	ctx.glDeleteBuffers			(1, &buf);
	ctx.glDeleteTextures		(1, &texture);
}